

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::RunContext::invokeActiveTestCase(RunContext *this)

{
  FatalConditionHandler fatalConditionHandler;
  FatalConditionHandler *in_stack_00000090;
  
  FatalConditionHandler::FatalConditionHandler(in_stack_00000090);
  TestCase::invoke((TestCase *)0x1283c9);
  FatalConditionHandler::reset();
  FatalConditionHandler::~FatalConditionHandler((FatalConditionHandler *)0x1283da);
  return;
}

Assistant:

void RunContext::invokeActiveTestCase() {
        FatalConditionHandler fatalConditionHandler; // Handle signals
        m_activeTestCase->invoke();
        fatalConditionHandler.reset();
    }